

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void crec_tailcall(jit_State *J,RecordFFData *rd,cTValue *tv)

{
  TRef TVar1;
  
  TVar1 = lj_ir_kgc(J,(GCobj *)(ulong)(tv->u32).lo,IRT_FUNC);
  J->base[-1] = TVar1 | 0x10000;
  rd->nres = -1;
  return;
}

Assistant:

static void crec_tailcall(jit_State *J, RecordFFData *rd, cTValue *tv)
{
  TRef kfunc = lj_ir_kfunc(J, funcV(tv));
#if LJ_FR2
  J->base[-2] = kfunc;
  J->base[-1] = TREF_FRAME;
#else
  J->base[-1] = kfunc | TREF_FRAME;
#endif
  rd->nres = -1;  /* Pending tailcall. */
}